

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O0

int read_models(uint numcpus,uv_cpu_info_t *ci)

{
  int iVar1;
  FILE *__stream;
  int *piVar2;
  char *pcVar3;
  size_t sVar4;
  FILE *fp;
  char *model;
  char buf [1024];
  uint speed_idx;
  uint model_idx;
  char *inferred_model;
  uv_cpu_info_t *ci_local;
  uint numcpus_local;
  
  buf[0x3fc] = '\0';
  buf[0x3fd] = '\0';
  buf[0x3fe] = '\0';
  buf[0x3ff] = '\0';
  buf[0x3f8] = '\0';
  buf[0x3f9] = '\0';
  buf[0x3fa] = '\0';
  buf[0x3fb] = '\0';
  __stream = (FILE *)uv__open_file("/proc/cpuinfo");
  if (__stream == (FILE *)0x0) {
    piVar2 = __errno_location();
    ci_local._4_4_ = -*piVar2;
  }
  else {
    while (pcVar3 = fgets((char *)&model,0x400,__stream), pcVar3 != (char *)0x0) {
      if (((uint)buf._1020_4_ < numcpus) &&
         (iVar1 = strncmp((char *)&model,"model name\t: ",0xd), iVar1 == 0)) {
        sVar4 = strlen(buf + 5);
        pcVar3 = uv__strndup(buf + 5,sVar4 - 1);
        if (pcVar3 == (char *)0x0) {
          fclose(__stream);
          return -0xc;
        }
        ci[(uint)buf._1020_4_].model = pcVar3;
        buf._1020_4_ = buf._1020_4_ + 1;
      }
      else if (((uint)buf._1016_4_ < numcpus) &&
              (iVar1 = strncmp((char *)&model,"cpu MHz\t\t: ",0xb), iVar1 == 0)) {
        iVar1 = atoi(buf + 3);
        ci[(uint)buf._1016_4_].speed = iVar1;
        buf._1016_4_ = buf._1016_4_ + 1;
      }
    }
    fclose(__stream);
    _speed_idx = "unknown";
    if (buf._1020_4_ != 0) {
      _speed_idx = ci[buf._1020_4_ - 1].model;
    }
    while ((uint)buf._1020_4_ < numcpus) {
      sVar4 = strlen(_speed_idx);
      pcVar3 = uv__strndup(_speed_idx,sVar4);
      if (pcVar3 == (char *)0x0) {
        return -0xc;
      }
      ci[(uint)buf._1020_4_].model = pcVar3;
      buf._1020_4_ = buf._1020_4_ + 1;
    }
    ci_local._4_4_ = 0;
  }
  return ci_local._4_4_;
}

Assistant:

static int read_models(unsigned int numcpus, uv_cpu_info_t* ci) {
  static const char model_marker[] = "model name\t: ";
  static const char speed_marker[] = "cpu MHz\t\t: ";
  const char* inferred_model;
  unsigned int model_idx;
  unsigned int speed_idx;
  char buf[1024];
  char* model;
  FILE* fp;

  /* Most are unused on non-ARM, non-MIPS and non-x86 architectures. */
  (void) &model_marker;
  (void) &speed_marker;
  (void) &speed_idx;
  (void) &model;
  (void) &buf;
  (void) &fp;

  model_idx = 0;
  speed_idx = 0;

#if defined(__arm__) || \
    defined(__i386__) || \
    defined(__mips__) || \
    defined(__x86_64__)
  fp = uv__open_file("/proc/cpuinfo");
  if (fp == NULL)
    return UV__ERR(errno);

  while (fgets(buf, sizeof(buf), fp)) {
    if (model_idx < numcpus) {
      if (strncmp(buf, model_marker, sizeof(model_marker) - 1) == 0) {
        model = buf + sizeof(model_marker) - 1;
        model = uv__strndup(model, strlen(model) - 1);  /* Strip newline. */
        if (model == NULL) {
          fclose(fp);
          return UV_ENOMEM;
        }
        ci[model_idx++].model = model;
        continue;
      }
    }
#if defined(__arm__) || defined(__mips__)
    if (model_idx < numcpus) {
#if defined(__arm__)
      /* Fallback for pre-3.8 kernels. */
      static const char model_marker[] = "Processor\t: ";
#else	/* defined(__mips__) */
      static const char model_marker[] = "cpu model\t\t: ";
#endif
      if (strncmp(buf, model_marker, sizeof(model_marker) - 1) == 0) {
        model = buf + sizeof(model_marker) - 1;
        model = uv__strndup(model, strlen(model) - 1);  /* Strip newline. */
        if (model == NULL) {
          fclose(fp);
          return UV_ENOMEM;
        }
        ci[model_idx++].model = model;
        continue;
      }
    }
#else  /* !__arm__ && !__mips__ */
    if (speed_idx < numcpus) {
      if (strncmp(buf, speed_marker, sizeof(speed_marker) - 1) == 0) {
        ci[speed_idx++].speed = atoi(buf + sizeof(speed_marker) - 1);
        continue;
      }
    }
#endif  /* __arm__ || __mips__ */
  }

  fclose(fp);
#endif  /* __arm__ || __i386__ || __mips__ || __x86_64__ */

  /* Now we want to make sure that all the models contain *something* because
   * it's not safe to leave them as null. Copy the last entry unless there
   * isn't one, in that case we simply put "unknown" into everything.
   */
  inferred_model = "unknown";
  if (model_idx > 0)
    inferred_model = ci[model_idx - 1].model;

  while (model_idx < numcpus) {
    model = uv__strndup(inferred_model, strlen(inferred_model));
    if (model == NULL)
      return UV_ENOMEM;
    ci[model_idx++].model = model;
  }

  return 0;
}